

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

int ipc_helper_closed_handle(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  undefined8 uVar3;
  void *pvVar4;
  undefined8 *extraout_RDX;
  uv_pipe_t *puVar5;
  uv_pipe_t *puVar6;
  ulong uVar7;
  undefined1 auStack_88 [16];
  uv_pipe_t *puStack_78;
  undefined1 auStack_70 [16];
  undefined1 auStack_60 [16];
  uv_pipe_t *puStack_50;
  undefined1 auStack_40 [8];
  code *pcStack_38;
  uv_pipe_t *puStack_30;
  
  memset(buffer,0x2e,100000);
  large_buf = (uv_buf_t)uv_buf_init(buffer,100000);
  uVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar3,&channel,1);
  if (iVar1 == 0) {
    puVar5 = &channel;
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_00162f72;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00162f77;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_00162f7c;
    uVar2 = write_until_data_queued();
    if (uVar2 != 0) {
      send_handle_and_close();
    }
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_00162f81;
    if (closed_handle_write != '\0') {
      puVar5 = (uv_pipe_t *)uv_default_loop();
      uv_walk(puVar5,close_walk_cb,0);
      uv_run(puVar5,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00162f8b;
    }
  }
  else {
    ipc_helper_closed_handle_cold_1();
    puVar5 = (uv_pipe_t *)buffer;
LAB_00162f72:
    ipc_helper_closed_handle_cold_2();
LAB_00162f77:
    ipc_helper_closed_handle_cold_3();
LAB_00162f7c:
    ipc_helper_closed_handle_cold_4();
LAB_00162f81:
    ipc_helper_closed_handle_cold_5();
  }
  ipc_helper_closed_handle_cold_6();
LAB_00162f8b:
  ipc_helper_closed_handle_cold_7();
  uVar7 = 0;
  puVar6 = (uv_pipe_t *)write_reqs;
  puStack_30 = puVar5;
  do {
    pcStack_38 = (code *)0x162fce;
    iVar1 = uv_write(puVar6,&channel,&large_buf,1,closed_handle_large_write_cb);
    if (iVar1 != 0) {
      pcStack_38 = send_handle_and_close;
      write_until_data_queued_cold_1();
      puStack_50 = (uv_pipe_t *)0x163009;
      uVar3 = uv_default_loop();
      puStack_50 = (uv_pipe_t *)0x163018;
      iVar1 = uv_tcp_init(uVar3,&tcp_server);
      if (iVar1 == 0) {
        puStack_50 = (uv_pipe_t *)0x163032;
        iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_40);
        if (iVar1 != 0) goto LAB_00163096;
        puStack_50 = (uv_pipe_t *)0x163049;
        iVar1 = uv_tcp_bind(&tcp_server,auStack_40,0);
        if (iVar1 != 0) goto LAB_0016309b;
        puStack_50 = (uv_pipe_t *)0x16307a;
        iVar1 = uv_write2(&write_req,&channel,&large_buf,1,&tcp_server,closed_handle_write_cb);
        if (iVar1 == 0) {
          puStack_50 = (uv_pipe_t *)0x16308c;
          iVar1 = uv_close(&tcp_server,0);
          return iVar1;
        }
      }
      else {
        puStack_50 = (uv_pipe_t *)0x163096;
        send_handle_and_close_cold_1();
LAB_00163096:
        puStack_50 = (uv_pipe_t *)0x16309b;
        send_handle_and_close_cold_2();
LAB_0016309b:
        puStack_50 = (uv_pipe_t *)0x1630a0;
        send_handle_and_close_cold_3();
      }
      puStack_50 = (uv_pipe_t *)ipc_helper_bind_twice;
      send_handle_and_close_cold_4();
      puStack_78 = (uv_pipe_t *)0x1630c0;
      puStack_50 = puVar6;
      iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_60);
      if (iVar1 == 0) {
        puStack_78 = (uv_pipe_t *)0x1630cd;
        uVar3 = uv_default_loop();
        puStack_78 = (uv_pipe_t *)0x1630e1;
        iVar1 = uv_pipe_init(uVar3,&channel,1);
        if (iVar1 != 0) goto LAB_0016326a;
        puVar6 = &channel;
        puStack_78 = (uv_pipe_t *)0x1630fa;
        uv_pipe_open(&channel,0);
        puStack_78 = (uv_pipe_t *)0x163102;
        iVar1 = uv_is_readable(&channel);
        if (iVar1 != 1) goto LAB_0016326f;
        puStack_78 = (uv_pipe_t *)0x163117;
        iVar1 = uv_is_writable(&channel);
        if (iVar1 != 1) goto LAB_00163274;
        puStack_78 = (uv_pipe_t *)0x16312c;
        iVar1 = uv_is_closing(&channel);
        if (iVar1 != 0) goto LAB_00163279;
        puStack_78 = (uv_pipe_t *)0x163145;
        auStack_70 = uv_buf_init("hello\n",6);
        puStack_78 = (uv_pipe_t *)0x163153;
        uVar3 = uv_default_loop();
        puStack_78 = (uv_pipe_t *)0x163162;
        iVar1 = uv_tcp_init(uVar3,&tcp_server);
        if (iVar1 != 0) goto LAB_0016327e;
        puStack_78 = (uv_pipe_t *)0x16316f;
        uVar3 = uv_default_loop();
        puStack_78 = (uv_pipe_t *)0x16317e;
        iVar1 = uv_tcp_init(uVar3,&tcp_server2);
        if (iVar1 != 0) goto LAB_00163283;
        puStack_78 = (uv_pipe_t *)0x163199;
        iVar1 = uv_tcp_bind(&tcp_server,auStack_60,0);
        if (iVar1 != 0) goto LAB_00163288;
        puStack_78 = (uv_pipe_t *)0x1631b4;
        iVar1 = uv_tcp_bind(&tcp_server2,auStack_60,0);
        if (iVar1 != 0) goto LAB_0016328d;
        puStack_78 = (uv_pipe_t *)0x1631e1;
        iVar1 = uv_write2(&write_req,&channel,auStack_70,1,&tcp_server,0);
        if (iVar1 != 0) goto LAB_00163292;
        puStack_78 = (uv_pipe_t *)0x16320e;
        iVar1 = uv_write2(&write_req2,&channel,auStack_70,1,&tcp_server2,0);
        if (iVar1 != 0) goto LAB_00163297;
        puStack_78 = (uv_pipe_t *)0x16321b;
        uVar3 = uv_default_loop();
        puStack_78 = (uv_pipe_t *)0x163225;
        iVar1 = uv_run(uVar3,0);
        if (iVar1 != 0) goto LAB_0016329c;
        puStack_78 = (uv_pipe_t *)0x16322e;
        puVar6 = (uv_pipe_t *)uv_default_loop();
        puStack_78 = (uv_pipe_t *)0x163242;
        uv_walk(puVar6,close_walk_cb,0);
        puStack_78 = (uv_pipe_t *)0x16324c;
        uv_run(puVar6,0);
        puStack_78 = (uv_pipe_t *)0x163251;
        uVar3 = uv_default_loop();
        puStack_78 = (uv_pipe_t *)0x163259;
        iVar1 = uv_loop_close(uVar3);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        puStack_78 = (uv_pipe_t *)0x16326a;
        ipc_helper_bind_twice_cold_1();
LAB_0016326a:
        puStack_78 = (uv_pipe_t *)0x16326f;
        ipc_helper_bind_twice_cold_2();
LAB_0016326f:
        puStack_78 = (uv_pipe_t *)0x163274;
        ipc_helper_bind_twice_cold_3();
LAB_00163274:
        puStack_78 = (uv_pipe_t *)0x163279;
        ipc_helper_bind_twice_cold_4();
LAB_00163279:
        puStack_78 = (uv_pipe_t *)0x16327e;
        ipc_helper_bind_twice_cold_5();
LAB_0016327e:
        puStack_78 = (uv_pipe_t *)0x163283;
        ipc_helper_bind_twice_cold_6();
LAB_00163283:
        puStack_78 = (uv_pipe_t *)0x163288;
        ipc_helper_bind_twice_cold_7();
LAB_00163288:
        puStack_78 = (uv_pipe_t *)0x16328d;
        ipc_helper_bind_twice_cold_8();
LAB_0016328d:
        puStack_78 = (uv_pipe_t *)0x163292;
        ipc_helper_bind_twice_cold_9();
LAB_00163292:
        puStack_78 = (uv_pipe_t *)0x163297;
        ipc_helper_bind_twice_cold_10();
LAB_00163297:
        puStack_78 = (uv_pipe_t *)0x16329c;
        ipc_helper_bind_twice_cold_11();
LAB_0016329c:
        puStack_78 = (uv_pipe_t *)0x1632a1;
        ipc_helper_bind_twice_cold_12();
      }
      puStack_78 = (uv_pipe_t *)ipc_helper_send_zero;
      ipc_helper_bind_twice_cold_13();
      puStack_78 = puVar6;
      auStack_88 = uv_buf_init(0,0);
      uVar3 = uv_default_loop();
      puVar5 = &channel;
      iVar1 = uv_pipe_init(uVar3,&channel,0);
      if (iVar1 == 0) {
        puVar5 = (uv_pipe_t *)0x0;
        uv_pipe_open(&channel);
        iVar1 = uv_is_readable(&channel);
        if (iVar1 != 1) goto LAB_001633a9;
        iVar1 = uv_is_writable(&channel);
        if (iVar1 != 1) goto LAB_001633ae;
        iVar1 = uv_is_closing(&channel);
        if (iVar1 != 0) goto LAB_001633b3;
        puVar5 = &channel;
        iVar1 = uv_write(&write_req,&channel,auStack_88,1,send_zero_write_cb);
        if (iVar1 != 0) goto LAB_001633b8;
        uVar3 = uv_default_loop();
        puVar5 = (uv_pipe_t *)0x0;
        iVar1 = uv_run(uVar3);
        if (iVar1 != 0) goto LAB_001633bd;
        if (send_zero_write == 1) {
          uVar3 = uv_default_loop();
          uv_walk(uVar3,close_walk_cb,0);
          puVar5 = (uv_pipe_t *)0x0;
          uv_run(uVar3);
          uVar3 = uv_default_loop();
          iVar1 = uv_loop_close(uVar3);
          if (iVar1 == 0) {
            return 0;
          }
          goto LAB_001633c7;
        }
      }
      else {
        ipc_helper_send_zero_cold_1();
LAB_001633a9:
        ipc_helper_send_zero_cold_2();
LAB_001633ae:
        ipc_helper_send_zero_cold_3();
LAB_001633b3:
        ipc_helper_send_zero_cold_4();
LAB_001633b8:
        ipc_helper_send_zero_cold_5();
LAB_001633bd:
        ipc_helper_send_zero_cold_6();
      }
      ipc_helper_send_zero_cold_7();
LAB_001633c7:
      ipc_helper_send_zero_cold_8();
      if ((int)puVar5 == 0) {
        send_zero_write = send_zero_write + 1;
        return extraout_EAX;
      }
      send_zero_write_cb_cold_1();
      pvVar4 = malloc((size_t)puVar5);
      *extraout_RDX = pvVar4;
      extraout_RDX[1] = puVar5;
      return (int)pvVar4;
    }
    if (0x12a < uVar7) break;
    uVar7 = uVar7 + 1;
    puVar6 = (uv_pipe_t *)puVar6->write_queue;
  } while (channel.write_queue_size == 0);
  return (int)channel.write_queue_size;
}

Assistant:

int ipc_helper_closed_handle(void) {
  int r;

  memset(buffer, '.', LARGE_SIZE);
  large_buf = uv_buf_init(buffer, LARGE_SIZE);

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  if (write_until_data_queued() > 0)
    send_handle_and_close();

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(closed_handle_write == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}